

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.h
# Opt level: O1

FileInfo * __thiscall
llbuild::basic::DeviceAgnosticFileSystem::getFileInfo
          (FileInfo *__return_storage_ptr__,DeviceAgnosticFileSystem *this,string *path)

{
  (*((this->impl)._M_t.
     super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
     ._M_t.
     super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
     .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl)->_vptr_FileSystem[7])
            ();
  __return_storage_ptr__->device = 0;
  __return_storage_ptr__->inode = 0;
  return __return_storage_ptr__;
}

Assistant:

virtual FileInfo getFileInfo(const std::string& path) override {
    auto info = impl->getFileInfo(path);

    // Device and inode numbers may (will) change when relocating files to
    // another device. Here we explicitly, unconditionally override them with 0,
    // enabling an entire build tree to be relocated or copied yet retain the
    // ability to perform incremental builds.
    info.device = 0;
    info.inode = 0;

    return info;
  }